

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>::
on_next_turn(stats_controller_t<so_5::details::no_lock_holder_t> *this,int run_id)

{
  int local_14;
  anon_class_16_2_5207774a local_10;
  
  local_10.run_id = &local_14;
  local_14 = run_id;
  local_10.this = this;
  details::no_lock_holder_t::
  lock_and_perform<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>::on_next_turn(int)::_lambda()_1_>
            ((no_lock_holder_t *)this,&local_10);
  return;
}

Assistant:

virtual void
		on_next_turn( int run_id ) override
			{
				this->lock_and_perform( [&] {
					if( status_t::on == m_status && run_id == m_run_id )
						{
							const auto actual_duration = distribute_current_data();

							if( actual_duration < m_distribution_period )
								// There is some time to sleep.
								send_next_message(
										m_distribution_period - actual_duration,
										m_run_id );
							else
								// We must distribute next portion of data
								// without long waiting.
								send_next_message( very_small_timeout(), m_run_id );
						}
				} );
			}